

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3DeferredToken *pFVar1;
  Fts3Expr *pFVar2;
  int *piVar3;
  int iVar4;
  char *__dest;
  char *pcVar5;
  Fts3Expr *pFVar6;
  Fts3Phrase *pFVar7;
  int iVar8;
  long lVar9;
  Fts3Expr *pFVar10;
  Fts3DeferredToken **ppFVar11;
  uint uVar12;
  uint uVar13;
  size_t __n;
  Fts3Expr *p;
  bool bVar14;
  char *aPoslist;
  char *p1;
  char *p2;
  char *local_68;
  Fts3Cursor *local_60;
  char *local_58;
  int *local_50;
  char *local_48;
  Fts3Expr *local_40;
  uint local_34;
  
  if (*pRc != 0) {
    return 1;
  }
  switch(pExpr->eType) {
  case 1:
  case 3:
    iVar4 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if ((iVar4 != 0) && (iVar4 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc), iVar4 != 0)) {
      if (*pRc != 0) {
        return 1;
      }
      if (pExpr->eType != 1) {
        return 1;
      }
      if (pExpr->bEof != '\0') {
        return 1;
      }
      if ((pExpr->pParent != (Fts3Expr *)0x0) && (pExpr->pParent->eType == 1)) {
        return 1;
      }
      iVar4 = 0;
      pFVar6 = pExpr->pLeft;
      pFVar10 = pExpr;
      while (pFVar2 = pFVar6, pFVar2 != (Fts3Expr *)0x0) {
        iVar4 = iVar4 + (pFVar10->pRight->pPhrase->doclist).nList;
        pFVar10 = pFVar2;
        pFVar6 = pFVar2->pLeft;
      }
      iVar4 = iVar4 + (pFVar10->pPhrase->doclist).nList;
      if (iVar4 != 0) {
        local_60 = pCsr;
        pcVar5 = (char *)sqlite3_malloc(iVar4 * 2);
        if (pcVar5 == (char *)0x0) {
          *pRc = 7;
          pCsr = local_60;
        }
        else {
          local_68 = (pFVar10->pPhrase->doclist).pList;
          local_58 = (char *)CONCAT44(local_58._4_4_,pFVar10->pPhrase->nToken);
          pFVar10 = pFVar10->pParent;
          if (pFVar10 == (Fts3Expr *)0x0) {
LAB_00180ab0:
            iVar4 = 1;
          }
          else {
            do {
              if (pFVar10->eType != 1) goto LAB_00180ab0;
              iVar4 = fts3EvalNearTrim(pFVar10->nNear,pcVar5,&local_68,(int *)&local_58,
                                       pFVar10->pRight->pPhrase);
            } while ((iVar4 != 0) && (pFVar10 = pFVar10->pParent, pFVar10 != (Fts3Expr *)0x0));
          }
          pFVar7 = pExpr->pRight->pPhrase;
          local_68 = (pFVar7->doclist).pList;
          local_58 = (char *)CONCAT44(local_58._4_4_,pFVar7->nToken);
          pFVar10 = pExpr->pLeft;
          if (iVar4 != 0 && pFVar10 != (Fts3Expr *)0x0) {
            do {
              pFVar6 = pFVar10;
              if (pFVar10->eType == 1) {
                pFVar6 = pFVar10->pRight;
              }
              iVar4 = fts3EvalNearTrim(pFVar10->pParent->nNear,pcVar5,&local_68,(int *)&local_58,
                                       pFVar6->pPhrase);
              pFVar10 = pFVar10->pLeft;
            } while ((pFVar10 != (Fts3Expr *)0x0) && (iVar4 != 0));
          }
          sqlite3_free(pcVar5);
          pCsr = local_60;
          if (iVar4 != 0) {
            return 1;
          }
        }
      }
    }
    if (pExpr->eType != 1) {
      return 0;
    }
    if ((pExpr->pParent != (Fts3Expr *)0x0) && (pExpr->pParent->eType == 1)) {
      return 0;
    }
    pFVar7 = pExpr->pPhrase;
    while (pFVar7 == (Fts3Phrase *)0x0) {
      if (pExpr->pRight->iDocid == pCsr->iPrevId) {
        pFVar7 = pExpr->pRight->pPhrase;
        if ((pFVar7->doclist).bFreeList != 0) {
          sqlite3_free((pFVar7->doclist).pList);
        }
        (pFVar7->doclist).pList = (char *)0x0;
        (pFVar7->doclist).nList = 0;
        (pFVar7->doclist).bFreeList = 0;
      }
      pExpr = pExpr->pLeft;
      pFVar7 = pExpr->pPhrase;
    }
    if (pExpr->iDocid != pCsr->iPrevId) {
      return 0;
    }
    if ((pFVar7->doclist).bFreeList != 0) {
      sqlite3_free((pFVar7->doclist).pList);
    }
    (pFVar7->doclist).pList = (char *)0x0;
    (pFVar7->doclist).nList = 0;
    (pFVar7->doclist).bFreeList = 0;
    return 0;
  case 2:
    iVar4 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    bVar14 = iVar4 == 0;
    goto LAB_00180950;
  case 4:
    iVar4 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    iVar8 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    return (uint)(iVar8 != 0 || iVar4 != 0);
  }
  if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
    local_50 = pRc;
    if (pExpr->iDocid == pCsr->iPrevId) {
      pFVar7 = pExpr->pPhrase;
      if (pExpr->bDeferred == '\0') goto LAB_00180790;
    }
    else {
      if (pExpr->bDeferred == '\0') goto LAB_0018093c;
      pFVar7 = pExpr->pPhrase;
    }
    if ((pFVar7->doclist).bFreeList != 0) {
      sqlite3_free((pFVar7->doclist).pList);
    }
    (pFVar7->doclist).pList = (char *)0x0;
    (pFVar7->doclist).nList = 0;
    (pFVar7->doclist).bFreeList = 0;
LAB_00180790:
    if (pFVar7->nToken < 1) {
LAB_00180972:
      iVar4 = 0;
    }
    else {
      ppFVar11 = &pFVar7->aToken[0].pDeferred;
      uVar12 = 0xffffffff;
      lVar9 = 0;
      __n = 0;
      pcVar5 = (char *)0x0;
      local_60 = pCsr;
      local_40 = pExpr;
      do {
        pFVar1 = *ppFVar11;
        __dest = pcVar5;
        if (pFVar1 != (Fts3DeferredToken *)0x0) {
          if (pFVar1->pList == (PendingList *)0x0) {
            sqlite3_free(pcVar5);
            (pFVar7->doclist).pList = (char *)0x0;
            (pFVar7->doclist).nList = 0;
            goto LAB_00180972;
          }
          local_34 = uVar12;
          __dest = (char *)sqlite3_malloc(pFVar1->pList->nData);
          if (__dest == (char *)0x0) {
            iVar4 = 7;
            pCsr = local_60;
            pExpr = local_40;
            goto LAB_001809be;
          }
          iVar4 = sqlite3Fts3GetVarint(pFVar1->pList->aData,(sqlite_int64 *)&local_68);
          __n = (long)pFVar1->pList->nData - (long)iVar4;
          memcpy(__dest,pFVar1->pList->aData + iVar4,__n);
          uVar12 = (uint)lVar9;
          pCsr = local_60;
          pExpr = local_40;
          if (pcVar5 != (char *)0x0) {
            local_68 = __dest;
            local_58 = pcVar5;
            local_48 = __dest;
            fts3PoslistPhraseMerge(&local_68,uVar12 - local_34,0,1,&local_58,&local_48);
            sqlite3_free(pcVar5);
            uVar13 = (int)local_68 - (int)__dest;
            __n = (size_t)uVar13;
            pCsr = local_60;
            pExpr = local_40;
            if (uVar13 == 0) {
              sqlite3_free(__dest);
              (pFVar7->doclist).pList = (char *)0x0;
              (pFVar7->doclist).nList = 0;
              iVar4 = 0;
              pCsr = local_60;
              pExpr = local_40;
              goto LAB_001809be;
            }
          }
        }
        piVar3 = local_50;
        lVar9 = lVar9 + 1;
        ppFVar11 = ppFVar11 + 5;
        pcVar5 = __dest;
      } while (lVar9 < pFVar7->nToken);
      iVar4 = 0;
      local_50 = piVar3;
      if (-1 < (int)uVar12) {
        uVar13 = pFVar7->iDoclistToken;
        if ((int)uVar13 < 0) {
          (pFVar7->doclist).pList = __dest;
          (pFVar7->doclist).nList = (int)__n;
          (pFVar7->doclist).iDocid = pCsr->iPrevId;
          (pFVar7->doclist).bFreeList = 1;
        }
        else {
          pcVar5 = (pFVar7->doclist).pList;
          local_58 = pcVar5;
          local_68 = __dest;
          if (uVar13 <= uVar12) {
            local_58 = __dest;
            local_68 = pcVar5;
          }
          local_48 = (char *)sqlite3_malloc((int)__n + 8);
          if (local_48 == (char *)0x0) {
            sqlite3_free(__dest);
            iVar4 = 7;
            local_50 = piVar3;
          }
          else {
            iVar4 = uVar12 - uVar13;
            if (uVar12 < uVar13) {
              iVar4 = -(uVar12 - uVar13);
            }
            (pFVar7->doclist).pList = local_48;
            iVar8 = 0;
            iVar4 = fts3PoslistPhraseMerge(&local_48,iVar4,0,1,&local_68,&local_58);
            if (iVar4 == 0) {
              sqlite3_free(local_48);
              (pFVar7->doclist).pList = (char *)0x0;
            }
            else {
              (pFVar7->doclist).bFreeList = 1;
              iVar8 = (int)local_48 - *(int *)&(pFVar7->doclist).pList;
            }
            (pFVar7->doclist).nList = iVar8;
            sqlite3_free(__dest);
            iVar4 = 0;
            local_50 = piVar3;
          }
        }
      }
    }
LAB_001809be:
    *local_50 = iVar4;
    pcVar5 = (pFVar7->doclist).pList;
    pExpr->iDocid = pCsr->iPrevId;
    return (uint)(pcVar5 != (char *)0x0);
  }
LAB_0018093c:
  if (pExpr->bEof != '\0') {
    return 0;
  }
  bVar14 = pExpr->iDocid == pCsr->iPrevId;
LAB_00180950:
  return (uint)bVar14;
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for 
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize 
        ** any instances of phrases that are part of unmatched NEAR queries. 
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0 
         && pExpr->eType==FTSQUERY_NEAR 
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred 
         && (pExpr->iDocid==pCsr->iPrevId || pExpr->bDeferred)
        ){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          assert( pExpr->bDeferred || pPhrase->doclist.bFreeList==0 );
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId);
        }
        break;
      }
    }
  }
  return bHit;
}